

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.cpp
# Opt level: O0

void test_qclab_dense_transpose<float>(void)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_12;
  M m5_1;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_11;
  M m4_1;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_10;
  M m3_2;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_9;
  M m2_2;
  Message local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_8;
  M m1_2;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_7;
  M m5;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_6;
  M m4;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  M m3_1;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_4;
  M m2_1;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  M m1_1;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  M m3;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  M m2;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  M m1;
  M check2T;
  M check1T;
  M check2;
  M check1;
  undefined1 local_28 [8];
  M matrix2;
  M matrix1;
  
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&matrix2.data_,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)local_28,1.0,5.0,9.0,13.0,2.0,6.0,10.0,14.0,3.0,7.0,11.0,15.0,
             4.0,8.0,12.0,16.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check2.data_,1.0,2.0,3.0,4.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check1T.data_,1.0,5.0,9.0,13.0,2.0,6.0,10.0,14.0,3.0,7.0,11.0,
             15.0,4.0,8.0,12.0,16.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&check2T.data_,1.0,3.0,2.0,4.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&m1.data_,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,11.0,12.0,
             13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar.message_,(SquareMatrix<float> *)&matrix2.data_);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (NoTrans,(SquareMatrix<float> *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_98,"m1","check1",(SquareMatrix<float> *)&gtest_ar.message_,
             (SquareMatrix<float> *)&check2.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.data_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.data_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_1.message_,(SquareMatrix<float> *)local_28);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (NoTrans,(SquareMatrix<float> *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_c8,"m2","check2",(SquareMatrix<float> *)&gtest_ar_1.message_,
             (SquareMatrix<float> *)&check1T.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3.data_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3.data_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  qclab::dense::operate<qclab::dense::SquareMatrix<float>>
            ((dense *)&gtest_ar_2.message_,NoTrans,(SquareMatrix<float> *)local_28);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_f8,"m3","check2",(SquareMatrix<float> *)&gtest_ar_2.message_,
             (SquareMatrix<float> *)&check1T.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_1.data_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_1.data_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_2.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_1.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar.message_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_3.message_,(SquareMatrix<float> *)&matrix2.data_);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (Trans,(SquareMatrix<float> *)&gtest_ar_3.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_128,"m1","check1T",(SquareMatrix<float> *)&gtest_ar_3.message_,
             (SquareMatrix<float> *)&check2T.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_1.data_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_1.data_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_4.message_,(SquareMatrix<float> *)local_28);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (Trans,(SquareMatrix<float> *)&gtest_ar_4.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_158,"m2","check2T",(SquareMatrix<float> *)&gtest_ar_4.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_1.data_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_1.data_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  qclab::dense::operate<qclab::dense::SquareMatrix<float>>
            ((dense *)&gtest_ar_5.message_,Trans,(SquareMatrix<float> *)local_28);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_188,"m3","check2T",(SquareMatrix<float> *)&gtest_ar_5.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4.data_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4.data_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_6.message_,(SquareMatrix<float> *)local_28);
  qclab::dense::transInPlace<qclab::dense::SquareMatrix<float>>
            ((SquareMatrix<float> *)&gtest_ar_6.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_1b8,"m4","check2T",(SquareMatrix<float> *)&gtest_ar_6.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5.data_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5.data_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  qclab::dense::trans<qclab::dense::SquareMatrix<float>>
            ((dense *)&gtest_ar_7.message_,(SquareMatrix<float> *)local_28);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_1e8,"m5","check2T",(SquareMatrix<float> *)&gtest_ar_7.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m1_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m1_2.data_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m1_2.data_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_6.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_4.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_3.message_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_8.message_,(SquareMatrix<float> *)&matrix2.data_);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (ConjTrans,(SquareMatrix<float> *)&gtest_ar_8.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_218,"m1","check1T",(SquareMatrix<float> *)&gtest_ar_8.message_,
             (SquareMatrix<float> *)&check2T.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2_2.data_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_2.data_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_9.message_,(SquareMatrix<float> *)local_28);
  qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>
            (ConjTrans,(SquareMatrix<float> *)&gtest_ar_9.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_248,"m2","check2T",(SquareMatrix<float> *)&gtest_ar_9.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m3_2.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m3_2.data_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m3_2.data_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  qclab::dense::operate<qclab::dense::SquareMatrix<float>>
            ((dense *)&gtest_ar_10.message_,ConjTrans,(SquareMatrix<float> *)local_28);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_278,"m3","check2T",(SquareMatrix<float> *)&gtest_ar_10.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m4_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m4_1.data_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m4_1.data_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar_11.message_,(SquareMatrix<float> *)local_28);
  qclab::dense::conjTransInPlace<qclab::dense::SquareMatrix<float>>
            ((SquareMatrix<float> *)&gtest_ar_11.message_);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_2a8,"m4","check2T",(SquareMatrix<float> *)&gtest_ar_11.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m5_1.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m5_1.data_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m5_1.data_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<float>>
            ((dense *)&gtest_ar_12.message_,(SquareMatrix<float> *)local_28);
  testing::internal::EqHelper::
  Compare<qclab::dense::SquareMatrix<float>,_qclab::dense::SquareMatrix<float>,_nullptr>
            ((EqHelper *)local_2d8,"m5","check2T",(SquareMatrix<float> *)&gtest_ar_12.message_,
             (SquareMatrix<float> *)&m1.data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/transpose.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_12.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_11.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_10.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_9.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar_8.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&m1.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check2T.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check1T.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&check2.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_28);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&matrix2.data_);
  return;
}

Assistant:

void test_qclab_dense_transpose() {

  using M = qclab::dense::SquareMatrix< T > ;

  M matrix1( 1 , 2 ,
             3 , 4 ) ;
  M matrix2( 1 , 5 ,  9 , 13 ,
             2 , 6 , 10 , 14 ,
             3 , 7 , 11 , 15 ,
             4 , 8 , 12 , 16 ) ;

  M check1( 1 , 2 ,
            3 , 4 ) ;
  M check2( 1 , 5 ,  9 , 13 ,
            2 , 6 , 10 , 14 ,
            3 , 7 , 11 , 15 ,
            4 , 8 , 12 , 16 ) ;

  M check1T( 1 , 3 ,
             2 , 4 ) ;
  M check2T(  1 ,  2 ,  3 ,  4 ,
              5 ,  6 ,  7 ,  8 ,
              9 , 10 , 11 , 12 ,
             13 , 14 , 15 , 16 ) ;

  // NoTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m1 ) ;
    EXPECT_EQ( m1 , check1 ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::NoTrans , m2 ) ;
    EXPECT_EQ( m2 , check2 ) ;
    M m3 = qclab::dense::operate( qclab::Op::NoTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2 ) ;
  }

  // Trans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::Trans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::Trans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::transInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::trans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

  // ConjTrans
  {
    M m1( matrix1 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m1 ) ;
    EXPECT_EQ( m1 , check1T ) ;
    M m2( matrix2 ) ;
    qclab::dense::operateInPlace( qclab::Op::ConjTrans , m2 ) ;
    EXPECT_EQ( m2 , check2T ) ;
    M m3 = qclab::dense::operate( qclab::Op::ConjTrans , matrix2 ) ;
    EXPECT_EQ( m3 , check2T ) ;
    M m4( matrix2 ) ;
    qclab::dense::conjTransInPlace( m4 ) ;
    EXPECT_EQ( m4 , check2T ) ;
    M m5 = qclab::dense::conjTrans( matrix2 ) ;
    EXPECT_EQ( m5 , check2T ) ;
  }

}